

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3NodeWrite(Fts3Table *p,SegmentNode *pTree,int iHeight,sqlite3_int64 iLeaf,
                 sqlite3_int64 iFree,sqlite3_int64 *piLast,char **paRoot,int *pnRoot)

{
  int iVar1;
  int nWrite;
  int nStart_1;
  sqlite3_int64 iNextLeaf;
  sqlite3_int64 iNextFree;
  SegmentNode *pIter;
  int nStart;
  int rc;
  sqlite3_int64 *piLast_local;
  sqlite3_int64 iFree_local;
  sqlite3_int64 iLeaf_local;
  int iHeight_local;
  SegmentNode *pTree_local;
  Fts3Table *p_local;
  
  pIter._4_4_ = 0;
  if (pTree->pParent == (SegmentNode *)0x0) {
    iVar1 = fts3TreeFinishNode(pTree,iHeight,iLeaf);
    *piLast = iFree + -1;
    *pnRoot = pTree->nData - iVar1;
    *paRoot = pTree->aData + iVar1;
  }
  else {
    _nWrite = iLeaf;
    iNextLeaf = iFree;
    for (iNextFree = (sqlite3_int64)pTree->pLeftmost; iNextFree != 0 && pIter._4_4_ == 0;
        iNextFree = *(sqlite3_int64 *)(iNextFree + 8)) {
      iVar1 = fts3TreeFinishNode((SegmentNode *)iNextFree,iHeight,_nWrite);
      pIter._4_4_ = fts3WriteSegment(p,iNextLeaf,(char *)(*(long *)(iNextFree + 0x40) + (long)iVar1)
                                     ,*(int *)(iNextFree + 0x38) - iVar1);
      iNextLeaf = iNextLeaf + 1;
      _nWrite = (*(int *)(iNextFree + 0x18) + 1) + _nWrite;
    }
    if (pIter._4_4_ == 0) {
      pIter._4_4_ = fts3NodeWrite(p,pTree->pParent,iHeight + 1,iFree,iNextLeaf,piLast,paRoot,pnRoot)
      ;
    }
  }
  return pIter._4_4_;
}

Assistant:

static int fts3NodeWrite(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentNode *pTree,             /* SegmentNode handle */
  int iHeight,                    /* Height of this node in tree */
  sqlite3_int64 iLeaf,            /* Block id of first leaf node */
  sqlite3_int64 iFree,            /* Block id of next free slot in %_segments */
  sqlite3_int64 *piLast,          /* OUT: Block id of last entry written */
  char **paRoot,                  /* OUT: Data for root node */
  int *pnRoot                     /* OUT: Size of root node in bytes */
){
  int rc = SQLITE_OK;

  if( !pTree->pParent ){
    /* Root node of the tree. */
    int nStart = fts3TreeFinishNode(pTree, iHeight, iLeaf);
    *piLast = iFree-1;
    *pnRoot = pTree->nData - nStart;
    *paRoot = &pTree->aData[nStart];
  }else{
    SegmentNode *pIter;
    sqlite3_int64 iNextFree = iFree;
    sqlite3_int64 iNextLeaf = iLeaf;
    for(pIter=pTree->pLeftmost; pIter && rc==SQLITE_OK; pIter=pIter->pRight){
      int nStart = fts3TreeFinishNode(pIter, iHeight, iNextLeaf);
      int nWrite = pIter->nData - nStart;
  
      rc = fts3WriteSegment(p, iNextFree, &pIter->aData[nStart], nWrite);
      iNextFree++;
      iNextLeaf += (pIter->nEntry+1);
    }
    if( rc==SQLITE_OK ){
      assert( iNextLeaf==iFree );
      rc = fts3NodeWrite(
          p, pTree->pParent, iHeight+1, iFree, iNextFree, piLast, paRoot, pnRoot
      );
    }
  }

  return rc;
}